

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  CURLUcode CVar1;
  ulong uVar2;
  CURLcode CVar3;
  ulong in_RAX;
  char *pcVar4;
  undefined7 in_register_00000009;
  CURLUcode CVar5;
  size_t sVar6;
  bool bVar7;
  byte *pbVar8;
  bool bVar9;
  uchar out [3];
  undefined8 uStack_38;
  
  CVar3 = CURLE_OK;
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,relative) == 0) {
    pcVar4 = strstr(url,"//");
    pbVar8 = (byte *)(pcVar4 + 2);
    if (pcVar4 == (char *)0x0) {
      pbVar8 = (byte *)url;
    }
    sVar6 = (long)pbVar8 - (long)url;
    while ((0x3f < (ulong)*pbVar8 || ((0x8000800000000001U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))) {
      pbVar8 = pbVar8 + 1;
      sVar6 = sVar6 + 1;
    }
    CVar3 = Curl_dyn_addn(o,url,sVar6);
    len = len - sVar6;
    url = (char *)pbVar8;
  }
  bVar9 = CVar3 == CURLE_OK;
  if (len != 0 && bVar9) {
    bVar7 = !query;
    do {
      len = len - 1;
      if (*url == 0x20) {
        if (bVar7) {
          sVar6 = 3;
          pcVar4 = "%20";
        }
        else {
          sVar6 = 1;
          pcVar4 = "+";
        }
LAB_00168438:
        CVar3 = Curl_dyn_addn(o,pcVar4,sVar6);
      }
      else {
        if ((byte)(*url + 0x81U) < 0xa1) {
          uVar2 = uStack_38 >> 0x30;
          uStack_38._0_6_ = CONCAT24(0x25,(undefined4)uStack_38);
          uStack_38 = CONCAT26((short)uVar2,(undefined6)uStack_38) & 0xff00ffffffffffff;
          Curl_hexbyte((uchar *)((long)&uStack_38 + 5),*url,true);
          sVar6 = 3;
          pcVar4 = (char *)((long)&uStack_38 + 4);
          goto LAB_00168438;
        }
        CVar3 = Curl_dyn_addn(o,url,1);
        if (*url == 0x3f) {
          bVar7 = false;
        }
      }
      bVar9 = CVar3 == CURLE_OK;
    } while ((len != 0) && (url = (char *)((byte *)url + 1), CVar3 == CURLE_OK));
  }
  CVar5 = CURLUE_OUT_OF_MEMORY;
  if (CVar3 == CURLE_TOO_LARGE) {
    CVar5 = CURLUE_TOO_LARGE;
  }
  CVar1 = CURLUE_OK;
  if (!bVar9) {
    CVar1 = CVar5;
  }
  return CVar1;
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result = CURLE_OK;

  if(!relative) {
    size_t n;
    host_sep = (const unsigned char *) find_host_sep(url);

    /* output the first piece as-is */
    n = (const char *)host_sep - url;
    result = Curl_dyn_addn(o, url, n);
    len -= n;
  }

  for(iptr = host_sep; len && !result; iptr++, len--) {
    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
    }
    else if((*iptr < ' ') || (*iptr >= 0x7f)) {
      unsigned char out[3]={'%'};
      Curl_hexbyte(&out[1], *iptr, TRUE);
      result = Curl_dyn_addn(o, out, 3);
    }
    else {
      result = Curl_dyn_addn(o, iptr, 1);
      if(*iptr == '?')
        left = FALSE;
    }
  }

  if(result)
    return cc2cu(result);
  return CURLUE_OK;
}